

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_handshake.c
# Opt level: O0

void nn_ws_handshake_start
               (nn_ws_handshake *self,nn_usock *usock,nn_pipebase *pipebase,int mode,char *resource,
               char *host)

{
  size_t sVar1;
  bool bVar2;
  char *host_local;
  char *resource_local;
  int mode_local;
  nn_pipebase *pipebase_local;
  nn_usock *usock_local;
  nn_ws_handshake *self_local;
  
  if ((mode == 1) && (sVar1 = strlen(resource), sVar1 == 0)) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","strlen (resource) >= 1",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/ws_handshake.c"
            ,0xc0);
    fflush(_stderr);
    nn_err_abort();
  }
  bVar2 = false;
  if (self->usock == (nn_usock *)0x0) {
    bVar2 = (self->usock_owner).fsm == (nn_fsm *)0x0;
  }
  if (bVar2) {
    (self->usock_owner).src = 1;
    (self->usock_owner).fsm = &self->fsm;
    nn_usock_swap_owner(usock,&self->usock_owner);
    self->usock = usock;
    self->pipebase = pipebase;
    self->mode = mode;
    self->resource = resource;
    self->remote_host = host;
    memset(self->opening_hs,0,0x1000);
    memset(self->response,0,0x200);
    self->recv_pos = 0;
    self->retries = 0;
    if (self->mode == 1) {
      self->recv_len = 0x10;
    }
    else {
      if (self->mode != 2) {
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/ws_handshake.c"
                ,0xe7);
        fflush(_stderr);
        nn_err_abort();
      }
      self->recv_len = 0x97;
    }
    nn_fsm_start(&self->fsm);
    return;
  }
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
          "self->usock == NULL && self->usock_owner.fsm == NULL",
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ws/ws_handshake.c"
          ,0xc3);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

void nn_ws_handshake_start (struct nn_ws_handshake *self,
    struct nn_usock *usock, struct nn_pipebase *pipebase,
    int mode, const char *resource, const char *host)
{
    /*  It's expected this resource has been allocated during intial connect. */
    if (mode == NN_WS_CLIENT)
        nn_assert (strlen (resource) >= 1);

    /*  Take ownership of the underlying socket. */
    nn_assert (self->usock == NULL && self->usock_owner.fsm == NULL);
    self->usock_owner.src = NN_WS_HANDSHAKE_SRC_USOCK;
    self->usock_owner.fsm = &self->fsm;
    nn_usock_swap_owner (usock, &self->usock_owner);
    self->usock = usock;
    self->pipebase = pipebase;
    self->mode = mode;
    self->resource = resource;
    self->remote_host = host;

    memset (self->opening_hs, 0, sizeof (self->opening_hs));
    memset (self->response, 0, sizeof (self->response));

    self->recv_pos = 0;
    self->retries = 0;

    /*  Calculate the absolute minimum length possible for a valid opening
        handshake. This is an optimization since we must poll for the
        remainder of the opening handshake in small byte chunks. */
    switch (self->mode) {
    case NN_WS_SERVER:
        self->recv_len = strlen (
            "GET x HTTP/1.1\r\n"
            "Upgrade: websocket\r\n"
            "Connection: Upgrade\r\n"
            "Host: x\r\n"
            "Origin: x\r\n"
            "Sec-WebSocket-Key: xxxxxxxxxxxxxxxxxxxxxxxx\r\n"
            "Sec-WebSocket-Version: xx\r\n\r\n");
        break;
    case NN_WS_CLIENT:
        /*  Shortest conceiveable response from server is a terse status. */
        self->recv_len = strlen ("HTTP/1.1 xxx\r\n\r\n");
        break;
    default:
        /*  Developer error; unexpected mode. */
        nn_assert (0);
        break;
    }

    /*  Launch the state machine. */
    nn_fsm_start (&self->fsm);
}